

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printjava.cc
# Opt level: O1

bool PrintJava::isArrayType(Datatype *ct)

{
  uint uVar1;
  
  if (ct->metatype == TYPE_PTR) {
    uVar1 = *(uint *)(ct[1]._vptr_Datatype + 6);
    if ((uVar1 < 8) &&
       (((0xacU >> (uVar1 & 0x1f) & 1) != 0 ||
        ((uVar1 == 6 && ((*(byte *)((long)ct[1]._vptr_Datatype + 0x34) & 0x32) != 0)))))) {
      return true;
    }
  }
  return false;
}

Assistant:

bool PrintJava::isArrayType(const Datatype *ct)

{
  if (ct->getMetatype() != TYPE_PTR)	// Java arrays are always Ghidra pointer types
    return false;
  ct = ((TypePointer *)ct)->getPtrTo();
  switch(ct->getMetatype()) {
  case TYPE_UINT:     // Pointer to unsigned is placeholder for class reference, not an array
    if (ct->isCharPrint())
      return true;
    break;
  case TYPE_INT:
  case TYPE_BOOL:
  case TYPE_FLOAT:	// Pointer to primitive type is an array
  case TYPE_PTR:	// Pointer to class reference is an array
    return true;
  default:
    break;
  }
  return false;
}